

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(unsigned_long lhs,
         SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
         rhs)

{
  bool bVar1;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *this;
  unsigned_long_long in_RSI;
  unsigned_long in_RDI;
  unsigned_long ret;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  result;
  unsigned_long *in_stack_ffffffffffffffb8;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffc0;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_20;
  unsigned_long local_18;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_10;
  unsigned_long_long local_8;
  
  local_18 = in_RDI;
  local_10.m_int = in_RSI;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  ::SafeInt(&local_20);
  bVar1 = DivisionCornerCaseHelper<unsigned_long_long,_unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1(local_18,local_10,&local_20);
  if (bVar1) {
    local_8 = local_20.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<unsigned_long_long,_unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
            ::DivisionCornerCase2(local_18,local_10,&local_20);
    if (bVar1) {
      local_8 = local_20.m_int;
    }
    else {
      this = (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)SafeInt::operator_cast_to_unsigned_long_long(in_stack_ffffffffffffffc0);
      DivisionHelper<unsigned_long,unsigned_long_long,0>::
      DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                ((unsigned_long *)this,in_stack_ffffffffffffffb8,(unsigned_long *)0x229f14);
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<unsigned_long>(this,in_stack_ffffffffffffffb8);
    }
  }
  return (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          )local_8;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}